

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  String *rhs;
  Enum EVar1;
  undefined8 *puVar2;
  byte bVar3;
  size_type sVar4;
  IReporter **curr_rep;
  undefined8 *puVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  EVar1 = (this->super_AssertData).m_at;
  if ((EVar1 & is_throws) == 0) {
    if ((~EVar1 & 0x60) == 0) {
      bVar3 = true;
      if ((this->super_AssertData).m_threw_as == true) {
LAB_001091dc:
        bVar3 = AssertData::StringContains::check
                          (&(this->super_AssertData).m_exception_string,
                           &(this->super_AssertData).m_exception);
        __x = extraout_XMM0_Qa;
        goto LAB_001091ee;
      }
    }
    else {
      if ((EVar1 & is_throws_as) != 0) {
        bVar3 = (this->super_AssertData).m_threw_as;
        goto LAB_001091ee;
      }
      if ((EVar1 & is_throws_with) != 0) goto LAB_001091dc;
      if (-1 < (char)EVar1) goto LAB_001091f3;
      bVar3 = (this->super_AssertData).m_threw;
    }
  }
  else {
    bVar3 = (this->super_AssertData).m_threw;
LAB_001091ee:
    bVar3 = bVar3 ^ 1;
  }
  (this->super_AssertData).m_failed = (bool)bVar3;
LAB_001091f3:
  bVar3 = (this->super_AssertData).m_exception.field_0.buf[0x17];
  if ((char)bVar3 < '\0') {
    sVar4 = (this->super_AssertData).m_exception.field_0.data.size;
  }
  else {
    sVar4 = 0x17 - (bVar3 & 0x1f);
  }
  if (sVar4 != 0) {
    rhs = &(this->super_AssertData).m_exception;
    String::String(&local_48,"\"");
    operator+(&local_60,&local_48,rhs);
    String::String(&SStack_78,"\"");
    operator+(&local_30,&local_60,&SStack_78);
    String::operator=(rhs,&local_30);
    String::~String(&local_30);
    String::~String(&SStack_78);
    String::~String(&local_60);
    String::~String(&local_48);
    __x = extraout_XMM0_Qa_00;
  }
  if (is_running_in_test == '\x01') {
    anon_unknown_15::addAssert((this->super_AssertData).m_at);
    puVar2 = *(undefined8 **)(g_cs + 0x10d8);
    __x = extraout_XMM0_Qa_01;
    for (puVar5 = *(undefined8 **)(g_cs + 0x10d0); puVar5 != puVar2; puVar5 = puVar5 + 1) {
      __x = (double)(**(code **)(*(long *)*puVar5 + 0x48))((long *)*puVar5,this);
    }
    if ((this->super_AssertData).m_failed != false) {
      anon_unknown_15::addFailedAssert((this->super_AssertData).m_at);
      __x = extraout_XMM0_Qa_03;
    }
  }
  else if ((this->super_AssertData).m_failed == true) {
    failed_out_of_a_testing_context(&this->super_AssertData);
    __x = extraout_XMM0_Qa_02;
  }
  if ((this->super_AssertData).m_failed == true) {
    isDebuggerActive();
    __x = extraout_XMM0_Qa_04;
  }
  return __x;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || !m_exception_string.check(m_exception);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = !m_exception_string.check(m_exception);
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }